

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<HasSize<InlinedVector<basic_string<char>,_4>_>::value_&&_HasData<InlinedVector<basic_string<char>,_4>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *v)

{
  ostream *poVar1;
  size_t sVar2;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  ostream *in_RDI;
  size_t i;
  const_pointer ptr;
  string *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  ostream *local_20;
  
  std::operator<<(in_RDI,"[ ");
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::data(in_RSI);
  local_20 = (ostream *)0x0;
  while( true ) {
    poVar1 = (ostream *)
             InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(in_RSI);
    if (poVar1 <= local_20) break;
    operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffd0 = local_20;
    sVar2 = InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (in_stack_ffffffffffffffd0 < (ostream *)(sVar2 - 1)) {
      std::operator<<(in_RDI,", ");
    }
    local_20 = local_20 + 1;
  }
  poVar1 = std::operator<<(in_RDI," ]");
  return poVar1;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}